

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRConstant * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::
allocate<spirv_cross::TypedID<(spirv_cross::Types)1>&>
          (ObjectPool<spirv_cross::SPIRConstant> *this,TypedID<(spirv_cross::Types)1> *p)

{
  Vector<spirv_cross::SPIRConstant_*> *this_00;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
  _Var1;
  size_t sVar2;
  _Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> _Var3;
  ulong count;
  SPIRConstant *this_01;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
  if (sVar2 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var1.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>)malloc(count * 0x168);
    if (_Var1.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl ==
        (SPIRConstant *)0x0) {
      return (SPIRConstant *)0x0;
    }
    SmallVector<spirv_cross::SPIRConstant_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
      _Var3._M_head_impl =
           (SPIRConstant *)
           _Var1.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRConstant_*,_0UL>::reserve(this_00,sVar2 + 1);
        sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar2] =
             _Var3._M_head_impl;
        sVar2 = sVar2 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size = sVar2;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
              .buffer_size + 1);
    sVar2 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
    .ptr[sVar2]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> =
         _Var1.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
    .buffer_size = sVar2 + 1;
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
    this_01 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar2 - 1];
    if (sVar2 == 0) goto LAB_0031e29a;
  }
  else {
    this_01 = (this_00->super_VectorView<spirv_cross::SPIRConstant_*>).ptr[sVar2 - 1];
  }
  SmallVector<spirv_cross::SPIRConstant_*,_0UL>::resize(this_00,sVar2 - 1);
LAB_0031e29a:
  SPIRConstant::SPIRConstant(this_01,p->id);
  return this_01;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}